

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reopen.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  time_t tVar2;
  GLFWmonitor **ppGVar3;
  GLFWwindow *handle;
  char *pcVar4;
  GLFWwindow *pGVar5;
  GLFWmonitor *monitor;
  byte bVar6;
  double dVar7;
  int monitorCount;
  int local_3c;
  double local_38;
  
  bVar6 = 0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    while( true ) {
      if ((bool)(bVar6 & 1)) {
        ppGVar3 = glfwGetMonitors(&local_3c);
        iVar1 = rand();
        monitor = ppGVar3[iVar1 % local_3c];
      }
      else {
        monitor = (GLFWmonitor *)0x0;
      }
      local_38 = glfwGetTime();
      handle = glfwCreateWindow(0x280,0x1e0,"Window Re-opener",monitor,(GLFWwindow *)0x0);
      pGVar5 = (GLFWwindow *)0x0;
      if (handle != (GLFWwindow *)0x0) {
        glfwMakeContextCurrent(handle);
        glfwSwapInterval(1);
        glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
        glfwSetWindowCloseCallback(handle,window_close_callback);
        glfwSetKeyCallback(handle,key_callback);
        pGVar5 = handle;
        if (monitor == (GLFWmonitor *)0x0) {
          dVar7 = glfwGetTime();
          printf("Opening regular window took %0.3f seconds\n",dVar7 - local_38);
        }
        else {
          pcVar4 = glfwGetMonitorName(monitor);
          dVar7 = glfwGetTime();
          printf("Opening full screen window on monitor %s took %0.3f seconds\n",dVar7 - local_38,
                 pcVar4);
        }
      }
      if (pGVar5 == (GLFWwindow *)0x0) break;
      glMatrixMode(0x1701);
      glOrtho(0xbff0000000000000,0x3ff0000000000000,0xbff0000000000000,0x3ff0000000000000,
              0x3ff0000000000000,0xbff0000000000000);
      glMatrixMode(0x1700);
      glfwSetTime(0.0);
      while (dVar7 = glfwGetTime(), dVar7 < 5.0) {
        glClear(0x4000);
        glPushMatrix();
        dVar7 = glfwGetTime();
        glRotatef((float)dVar7 * 100.0,0,0,0x3f800000);
        glRectf(0xbf000000,0xbf000000,0x3f800000,0x3f800000);
        glPopMatrix();
        glfwSwapBuffers(pGVar5);
        glfwPollEvents();
        iVar1 = glfwWindowShouldClose(pGVar5);
        if (iVar1 != 0) {
          close_window(pGVar5);
          puts("User closed window");
          glfwTerminate();
          exit(0);
        }
      }
      puts("Closing window");
      close_window(pGVar5);
      bVar6 = bVar6 + 1;
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int count = 0;
    GLFWwindow* window;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    for (;;)
    {
        GLFWmonitor* monitor = NULL;

        if (count & 1)
        {
            int monitorCount;
            GLFWmonitor** monitors = glfwGetMonitors(&monitorCount);
            monitor = monitors[rand() % monitorCount];
        }

        window = open_window(640, 480, monitor);
        if (!window)
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glMatrixMode(GL_PROJECTION);
        glOrtho(-1.f, 1.f, -1.f, 1.f, 1.f, -1.f);
        glMatrixMode(GL_MODELVIEW);

        glfwSetTime(0.0);

        while (glfwGetTime() < 5.0)
        {
            glClear(GL_COLOR_BUFFER_BIT);

            glPushMatrix();
            glRotatef((GLfloat) glfwGetTime() * 100.f, 0.f, 0.f, 1.f);
            glRectf(-0.5f, -0.5f, 1.f, 1.f);
            glPopMatrix();

            glfwSwapBuffers(window);
            glfwPollEvents();

            if (glfwWindowShouldClose(window))
            {
                close_window(window);
                printf("User closed window\n");

                glfwTerminate();
                exit(EXIT_SUCCESS);
            }
        }

        printf("Closing window\n");
        close_window(window);

        count++;
    }

    glfwTerminate();
}